

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O0

void __thiscall
capnp::JsonCodec::AnnotatedEnumHandler::encode
          (AnnotatedEnumHandler *this,JsonCodec *codec,DynamicEnum input,Builder output)

{
  uint16_t uVar1;
  uint uVar2;
  NullableValue<capnp::EnumSchema::Enumerant> *other;
  Enumerant *pEVar3;
  size_t sVar4;
  StringPtr *value;
  ArrayPtr<const_char> local_e0;
  Fault local_d0;
  Fault f;
  Maybe<capnp::EnumSchema::Enumerant> local_b8;
  undefined1 local_70 [8];
  NullableValue<capnp::EnumSchema::Enumerant> e;
  JsonCodec *codec_local;
  AnnotatedEnumHandler *this_local;
  DynamicEnum input_local;
  
  this_local = (AnnotatedEnumHandler *)input.schema.super_Schema.raw;
  input_local.schema.super_Schema.raw._0_2_ = input.value;
  e.field_1._56_8_ = codec;
  DynamicEnum::getEnumerant(&local_b8,(DynamicEnum *)&this_local);
  other = kj::_::readMaybe<capnp::EnumSchema::Enumerant>(&local_b8);
  kj::_::NullableValue<capnp::EnumSchema::Enumerant>::NullableValue
            ((NullableValue<capnp::EnumSchema::Enumerant> *)local_70,other);
  kj::Maybe<capnp::EnumSchema::Enumerant>::~Maybe(&local_b8);
  pEVar3 = kj::_::NullableValue::operator_cast_to_Enumerant_((NullableValue *)local_70);
  if (pEVar3 == (Enumerant *)0x0) {
    uVar1 = DynamicEnum::getRaw((DynamicEnum *)&this_local);
    json::Value::Builder::setNumber(&output,(double)uVar1);
  }
  else {
    pEVar3 = kj::_::NullableValue<capnp::EnumSchema::Enumerant>::operator->
                       ((NullableValue<capnp::EnumSchema::Enumerant> *)local_70);
    uVar2 = EnumSchema::Enumerant::getIndex(pEVar3);
    sVar4 = kj::Array<kj::StringPtr>::size(&this->valueToName);
    if (sVar4 <= uVar2) {
      kj::_::Debug::Fault::Fault
                (&local_d0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x54f,FAILED,"e->getIndex() < valueToName.size()","");
      kj::_::Debug::Fault::fatal(&local_d0);
    }
    pEVar3 = kj::_::NullableValue<capnp::EnumSchema::Enumerant>::operator->
                       ((NullableValue<capnp::EnumSchema::Enumerant> *)local_70);
    uVar2 = EnumSchema::Enumerant::getIndex(pEVar3);
    value = kj::Array<kj::StringPtr>::operator[](&this->valueToName,(ulong)uVar2);
    Text::Reader::Reader((Reader *)&local_e0,value);
    json::Value::Builder::setString(&output,(Reader)local_e0);
  }
  kj::_::NullableValue<capnp::EnumSchema::Enumerant>::~NullableValue
            ((NullableValue<capnp::EnumSchema::Enumerant> *)local_70);
  return;
}

Assistant:

void encode(const JsonCodec& codec, DynamicEnum input, JsonValue::Builder output) const override {
    KJ_IF_MAYBE(e, input.getEnumerant()) {
      KJ_ASSERT(e->getIndex() < valueToName.size());
      output.setString(valueToName[e->getIndex()]);
    } else {
      output.setNumber(input.getRaw());
    }